

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.h
# Opt level: O2

string * __thiscall
aeron::Context::cncFileName_abi_cxx11_(string *__return_storage_ptr__,Context *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,&this->m_dirName,"/");
  std::operator+(__return_storage_ptr__,&local_30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CncFileDescriptor::CNC_FILE_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

inline const std::string cncFileName()
    {
        return m_dirName + "/" + CncFileDescriptor::CNC_FILE;
    }